

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

char * yysymbol_name(yysymbol_kind_t yysymbol)

{
  yysymbol_kind_t yysymbol_local;
  
  return yysymbol_name::yy_sname[yysymbol];
}

Assistant:

static const char *
yysymbol_name (yysymbol_kind_t yysymbol)
{
  static const char *const yy_sname[] =
  {
  "end of file", "error", "invalid token", "number", "string", ".", ",",
  ":", "::", "[", "]", "(", ")", "newline", "!", "&&", "||", ">", "<",
  ">=", "<=", "!=", "==", "+", "-", "|", "^", "&", "<<", ">>", ">>>", "*",
  "/", "%", "~", "NEG", "**", "DEF", "BANK", "ALIGN", "SIZEOF", "STARTOF",
  "SIN", "COS", "TAN", "ASIN", "ACOS", "ATAN", "ATAN2", "FDIV", "FMUL",
  "FMOD", "POW", "LOG", "ROUND", "CEIL", "FLOOR", "HIGH", "LOW", "ISCONST",
  "STRCMP", "STRIN", "STRRIN", "STRSUB", "STRLEN", "STRCAT", "STRUPR",
  "STRLWR", "STRRPL", "STRFMT", "CHARLEN", "CHARSUB", "INCHARMAP", "label",
  "identifier", "local identifier", "anonymous label", "EQU", "=", "EQUS",
  "+=", "-=", "*=", "/=", "%=", "|=", "^=", "&=", "<<=", ">>=", "INCLUDE",
  "PRINT", "PRINTLN", "IF", "ELIF", "ELSE", "ENDC", "EXPORT", "DB", "DS",
  "DW", "DL", "SECTION", "FRAGMENT", "ENDSECTION", "RB", "RW", "MACRO",
  "ENDM", "RSRESET", "RSSET", "UNION", "NEXTU", "ENDU", "INCBIN", "REPT",
  "FOR", "CHARMAP", "NEWCHARMAP", "SETCHARMAP", "PUSHC", "POPC", "SHIFT",
  "ENDR", "BREAK", "LOAD", "ENDL", "FAIL", "WARN", "FATAL", "ASSERT",
  "STATIC_ASSERT", "PURGE", "REDEF", "POPS", "PUSHS", "POPO", "PUSHO",
  "OPT", "ROM0", "ROMX", "WRAM0", "WRAMX", "HRAM", "VRAM", "SRAM", "OAM",
  "adc", "add", "and", "bit", "call", "ccf", "cp", "cpl", "daa", "dec",
  "di", "ei", "halt", "inc", "jp", "jr", "ld", "ldi", "ldd", "ldh", "nop",
  "or", "pop", "push", "res", "ret", "reti", "rst", "rl", "rla", "rlc",
  "rlca", "rr", "rra", "rrc", "rrca", "sbc", "scf", "set", "stop", "sla",
  "sra", "srl", "sub", "swap", "xor", "a", "b", "c", "d", "e", "h", "l",
  "af", "bc", "de", "sp", "hl", "hld/hl-", "hli/hl+", "nz", "z", "nc",
  "end of buffer", "$accept", "asmfile", "lines", "endofline",
  "opt_diff_mark", "line", "$@1", "$@2", "line_directive", "if", "elif",
  "else", "plain_directive", "endc", "def_id", "$@3", "redef_id", "$@4",
  "scoped_id", "scoped_anon_id", "label", "macro", "$@5", "macroargs",
  "assignment_directive", "directive", "trailing_comma", "compoundeq",
  "equ", "assignment", "equs", "rb", "rw", "rl", "align", "opt", "$@6",
  "opt_list", "opt_list_entry", "popo", "pusho", "pops", "pushs",
  "endsection", "fail", "warn", "assert_type", "assert", "shift", "load",
  "rept", "@7", "for", "$@8", "$@9", "@10", "for_args", "break",
  "macrodef", "$@11", "$@12", "@13", "rsset", "rsreset", "rs_uconst",
  "union", "nextu", "endu", "ds", "ds_align", "ds_args", "db", "dw", "dl",
  "def_equ", "redef_equ", "def_set", "def_rb", "def_rw", "def_rl",
  "def_equs", "redef_equs", "purge", "$@14", "purge_args", "export",
  "export_list", "export_list_entry", "include", "incbin", "charmap",
  "newcharmap", "setcharmap", "pushc", "popc", "print", "println",
  "print_exprs", "print_expr", "const_3bit", "constlist_8bit",
  "constlist_8bit_entry", "constlist_16bit", "constlist_16bit_entry",
  "constlist_32bit", "constlist_32bit_entry", "reloc_8bit",
  "reloc_8bit_no_str", "reloc_8bit_offset", "reloc_16bit",
  "reloc_16bit_no_str", "relocexpr", "relocexpr_no_str", "$@15", "uconst",
  "const", "const_no_str", "const_8bit", "opt_q_arg", "string",
  "strcat_args", "strfmt_args", "strfmt_va_args", "section", "sectmod",
  "sectiontype", "sectorg", "sectattrs", "cpu_commands", "cpu_command",
  "z80_adc", "z80_add", "z80_and", "z80_bit", "z80_call", "z80_ccf",
  "z80_cp", "z80_cpl", "z80_daa", "z80_dec", "z80_di", "z80_ei",
  "z80_halt", "z80_inc", "z80_jp", "z80_jr", "z80_ldi", "z80_ldd",
  "z80_ldio", "c_ind", "z80_ld", "z80_ld_hl", "z80_ld_sp", "z80_ld_mem",
  "z80_ld_cind", "z80_ld_rr", "z80_ld_r", "z80_ld_a", "z80_ld_ss",
  "z80_nop", "z80_or", "z80_pop", "z80_push", "z80_res", "z80_ret",
  "z80_reti", "z80_rl", "z80_rla", "z80_rlc", "z80_rlca", "z80_rr",
  "z80_rra", "z80_rrc", "z80_rrca", "z80_rst", "z80_sbc", "z80_scf",
  "z80_set", "z80_sla", "z80_sra", "z80_srl", "z80_stop", "z80_sub",
  "z80_swap", "z80_xor", "op_mem_ind", "op_a_r", "op_a_n", "T_MODE_A",
  "T_MODE_B", "T_MODE_C", "T_MODE_D", "T_MODE_E", "T_MODE_H", "T_MODE_L",
  "ccode_expr", "ccode", "reg_r", "reg_tt", "reg_ss", "reg_rr",
  "hl_ind_inc", "hl_ind_dec", YY_NULLPTR
  };
  return yy_sname[yysymbol];
}